

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void ts_stack_clear(Stack *self)

{
  uint uVar1;
  StackHead *pSVar2;
  uint32_t i;
  ulong uVar3;
  long lVar4;
  
  stack_node_retain(self->base_node);
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < (self->heads).size; uVar3 = uVar3 + 1) {
    stack_head_delete((StackHead *)((long)&((self->heads).contents)->node + lVar4),&self->node_pool,
                      self->subtree_pool);
    lVar4 = lVar4 + 0x28;
  }
  (self->heads).size = 0;
  array__grow((VoidArray *)self,0x28);
  pSVar2 = (self->heads).contents;
  uVar1 = (self->heads).size;
  (self->heads).size = uVar1 + 1;
  pSVar2[uVar1].node = self->base_node;
  pSVar2[uVar1].status = StackStatusActive;
  pSVar2[uVar1].last_external_token.ptr = (SubtreeHeapData *)0x0;
  (&pSVar2[uVar1].last_external_token)[1].ptr = (SubtreeHeapData *)0x0;
  *(undefined8 *)((long)&pSVar2[uVar1].summary + 6) = 0;
  return;
}

Assistant:

void ts_stack_clear(Stack *self) {
  stack_node_retain(self->base_node);
  for (uint32_t i = 0; i < self->heads.size; i++) {
    stack_head_delete(&self->heads.contents[i], &self->node_pool, self->subtree_pool);
  }
  array_clear(&self->heads);
  array_push(&self->heads, ((StackHead){
    .node = self->base_node,
    .last_external_token = NULL_SUBTREE,
    .status = StackStatusActive,
    .lookahead_when_paused = 0,
  }));
}